

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDiurnal_kry.c
# Opt level: O0

int Precond(sunrealtype tn,N_Vector u,N_Vector fu,int jok,int *jcurPtr,sunrealtype gamma,
           void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long *plVar6;
  undefined8 uVar7;
  long lVar8;
  undefined4 *in_RCX;
  int in_EDX;
  undefined8 in_RDI;
  long in_R8;
  double dVar9;
  double dVar10;
  ulong in_XMM1_Qa;
  UserData data;
  sunrealtype **j;
  sunrealtype **a;
  sunrealtype *udata;
  int jy;
  int jx;
  sunindextype retval;
  sunindextype *(*pivot) [10];
  sunrealtype **(*Jbd) [10];
  sunrealtype **(*P) [10];
  sunrealtype hordco;
  sunrealtype verdco;
  sunrealtype dely;
  sunrealtype q4coef;
  sunrealtype yup;
  sunrealtype ydn;
  sunrealtype diag;
  sunrealtype cyup;
  sunrealtype cydn;
  sunrealtype c2;
  sunrealtype c1;
  int local_c0;
  int local_bc;
  
  lVar8 = N_VGetArrayPointer(in_RDI);
  if (in_EDX == 0) {
    dVar1 = *(double *)(in_R8 + 0x960);
    dVar2 = *(double *)(in_R8 + 0x978);
    dVar3 = *(double *)(in_R8 + 0x990);
    dVar4 = *(double *)(in_R8 + 0x980);
    for (local_c0 = 0; local_c0 < 10; local_c0 = local_c0 + 1) {
      dVar9 = ((double)local_c0 - 0.5) * dVar2 + 30.0;
      dVar10 = exp(dVar9 * 0.2);
      dVar9 = exp((dVar9 + dVar2) * 0.2);
      dVar9 = -(dVar4 + dVar4 + dVar3 * dVar10 + dVar3 * dVar9);
      for (local_bc = 0; local_bc < 10; local_bc = local_bc + 1) {
        dVar10 = *(double *)(lVar8 + (long)(local_bc * 2 + local_c0 * 0x14) * 8);
        dVar5 = *(double *)(lVar8 + (long)(local_bc * 2 + 1 + local_c0 * 0x14) * 8);
        plVar6 = *(long **)(in_R8 + 800 + (long)local_bc * 0x50 + (long)local_c0 * 8);
        uVar7 = *(undefined8 *)(in_R8 + (long)local_bc * 0x50 + (long)local_c0 * 8);
        *(double *)*plVar6 = dVar5 * -4.66e-16 + -6.031000000000001 + dVar9;
        *(double *)plVar6[1] = dVar10 * -4.66e-16 + dVar1;
        *(double *)(*plVar6 + 8) = dVar5 * -4.66e-16 + 6.031000000000001;
        *(double *)(plVar6[1] + 8) = dVar10 * -4.66e-16 + -dVar1 + dVar9;
        SUNDlsMat_denseCopy(plVar6,uVar7,2);
      }
    }
    *in_RCX = 1;
  }
  else {
    for (local_c0 = 0; local_c0 < 10; local_c0 = local_c0 + 1) {
      for (local_bc = 0; local_bc < 10; local_bc = local_bc + 1) {
        SUNDlsMat_denseCopy(*(undefined8 *)
                             (in_R8 + 800 + (long)local_bc * 0x50 + (long)local_c0 * 8),
                            *(undefined8 *)(in_R8 + (long)local_bc * 0x50 + (long)local_c0 * 8),2);
      }
    }
    *in_RCX = 0;
  }
  for (local_c0 = 0; local_c0 < 10; local_c0 = local_c0 + 1) {
    for (local_bc = 0; local_bc < 10; local_bc = local_bc + 1) {
      SUNDlsMat_denseScale
                (in_XMM1_Qa ^ 0x8000000000000000,
                 *(undefined8 *)(in_R8 + (long)local_bc * 0x50 + (long)local_c0 * 8),2);
    }
  }
  local_bc = 0;
  do {
    if (9 < local_bc) {
      return 0;
    }
    for (local_c0 = 0; local_c0 < 10; local_c0 = local_c0 + 1) {
      SUNDlsMat_denseAddIdentity
                (*(undefined8 *)(in_R8 + (long)local_bc * 0x50 + (long)local_c0 * 8),2);
      lVar8 = SUNDlsMat_denseGETRF
                        (*(undefined8 *)(in_R8 + (long)local_bc * 0x50 + (long)local_c0 * 8),2,2,
                         *(undefined8 *)(in_R8 + 0x640 + (long)local_bc * 0x50 + (long)local_c0 * 8)
                        );
      if (lVar8 != 0) {
        return 1;
      }
    }
    local_bc = local_bc + 1;
  } while( true );
}

Assistant:

static int Precond(sunrealtype tn, N_Vector u, N_Vector fu, sunbooleantype jok,
                   sunbooleantype* jcurPtr, sunrealtype gamma, void* user_data)
{
  sunrealtype c1, c2, cydn, cyup, diag, ydn, yup, q4coef, dely, verdco, hordco;
  sunrealtype**(*P)[MY], **(*Jbd)[MY];
  sunindextype*(*pivot)[MY], retval;
  int jx, jy;
  sunrealtype *udata, **a, **j;
  UserData data;

  /* Make local copies of pointers in user_data, and of pointer to u's data */

  data  = (UserData)user_data;
  P     = data->P;
  Jbd   = data->Jbd;
  pivot = data->pivot;
  udata = N_VGetArrayPointer(u);

  if (jok)
  {
    /* jok = SUNTRUE: Copy Jbd to P */

    for (jy = 0; jy < MY; jy++)
    {
      for (jx = 0; jx < MX; jx++)
      {
        SUNDlsMat_denseCopy(Jbd[jx][jy], P[jx][jy], NUM_SPECIES, NUM_SPECIES);
      }
    }

    *jcurPtr = SUNFALSE;
  }

  else
  {
    /* jok = SUNFALSE: Generate Jbd from scratch and copy to P */

    /* Make local copies of problem variables, for efficiency. */

    q4coef = data->q4;
    dely   = data->dy;
    verdco = data->vdco;
    hordco = data->hdco;

    /* Compute 2x2 diagonal Jacobian blocks (using q4 values
       computed on the last f call).  Load into P. */

    for (jy = 0; jy < MY; jy++)
    {
      ydn  = YMIN + (jy - SUN_RCONST(0.5)) * dely;
      yup  = ydn + dely;
      cydn = verdco * exp(SUN_RCONST(0.2) * ydn);
      cyup = verdco * exp(SUN_RCONST(0.2) * yup);
      diag = -(cydn + cyup + TWO * hordco);
      for (jx = 0; jx < MX; jx++)
      {
        c1            = IJKth(udata, 1, jx, jy);
        c2            = IJKth(udata, 2, jx, jy);
        j             = Jbd[jx][jy];
        a             = P[jx][jy];
        IJth(j, 1, 1) = (-Q1 * C3 - Q2 * c2) + diag;
        IJth(j, 1, 2) = -Q2 * c1 + q4coef;
        IJth(j, 2, 1) = Q1 * C3 - Q2 * c2;
        IJth(j, 2, 2) = (-Q2 * c1 - q4coef) + diag;
        SUNDlsMat_denseCopy(j, a, NUM_SPECIES, NUM_SPECIES);
      }
    }

    *jcurPtr = SUNTRUE;
  }

  /* Scale by -gamma */

  for (jy = 0; jy < MY; jy++)
  {
    for (jx = 0; jx < MX; jx++)
    {
      SUNDlsMat_denseScale(-gamma, P[jx][jy], NUM_SPECIES, NUM_SPECIES);
    }
  }

  /* Add identity matrix and do LU decompositions on blocks in place. */

  for (jx = 0; jx < MX; jx++)
  {
    for (jy = 0; jy < MY; jy++)
    {
      SUNDlsMat_denseAddIdentity(P[jx][jy], NUM_SPECIES);
      retval = SUNDlsMat_denseGETRF(P[jx][jy], NUM_SPECIES, NUM_SPECIES,
                                    pivot[jx][jy]);
      if (retval != 0) { return (1); }
    }
  }

  return (0);
}